

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

void wabt::anon_unknown_1::AppendInlineExportFields
               (Module *module,ModuleFieldList *fields,Index index)

{
  ModuleField *pMVar1;
  Location last_field_loc;
  Location local_98;
  Var local_78;
  
  if ((module->fields).size_ == 0) {
    __assert_fail("!empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/intrusive-list.h"
                  ,400,
                  "typename intrusive_list<T>::reference wabt::intrusive_list<wabt::ModuleField>::back() [T = wabt::ModuleField]"
                 );
  }
  pMVar1 = (module->fields).last_;
  local_98.filename._M_len = (pMVar1->loc).filename._M_len;
  local_98.filename._M_str = (pMVar1->loc).filename._M_str;
  local_98.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       (pMVar1->loc).field_1.field_1.offset;
  local_98.field_1._8_8_ = *(undefined8 *)((long)&(pMVar1->loc).field_1 + 8);
  pMVar1 = fields->first_;
  if (pMVar1 != (ModuleField *)0x0) {
    do {
      if (pMVar1->type_ != Export) {
        __assert_fail("isa<Derived>(base)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/cast.h"
                      ,0x4e,
                      "Derived *wabt::cast(Base *) [Derived = wabt::ExportModuleField, Base = wabt::ModuleField]"
                     );
      }
      Var::Var(&local_78,index,&local_98);
      Var::operator=((Var *)&pMVar1[1].loc.field_1.field_0,&local_78);
      Var::~Var(&local_78);
      pMVar1 = (pMVar1->super_intrusive_list_base<wabt::ModuleField>).next_;
    } while (pMVar1 != (ModuleField *)0x0);
  }
  Module::AppendFields(module,fields);
  return;
}

Assistant:

Result CheckFuncTypeVarMatchesExplicit(const Location& loc,
                                       const Module& module,
                                       const FuncDeclaration& decl,
                                       Errors* errors) {
  Result result = Result::Ok;
  if (decl.has_func_type) {
    const FuncType* func_type = module.GetFuncType(decl.type_var);
    if (func_type) {
      result |=
          CheckTypes(loc, decl.sig.result_types, func_type->sig.result_types,
                     "function", "result", errors);
      result |=
          CheckTypes(loc, decl.sig.param_types, func_type->sig.param_types,
                     "function", "argument", errors);
    } else if (!(decl.sig.param_types.empty() &&
                 decl.sig.result_types.empty())) {
      // We want to check whether the function type at the explicit index
      // matches the given param and result types. If they were omitted then
      // they'll be resolved automatically (see
      // ResolveFuncTypeWithEmptySignature), but if they are provided then we
      // have to check. If we get here then the type var is invalid, so we
      // can't check whether they match.
      if (decl.type_var.is_index()) {
        errors->emplace_back(ErrorLevel::Error, loc,
                             StringPrintf("invalid func type index %" PRIindex,
                                          decl.type_var.index()));
      } else {
        errors->emplace_back(ErrorLevel::Error, loc,
                             StringPrintf("expected func type identifier %s",
                                          decl.type_var.name().c_str()));
      }
      result = Result::Error;
    }
  }
  return result;
}